

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doGetUsedFuncs(DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,FuncSet *dst)

{
  size_type sVar1;
  SharedPtr<const_vkt::shaderexecutor::Statement> *this_00;
  Statement *this_01;
  ExprBase *this_02;
  pair<std::_Rb_tree_const_iterator<const_vkt::shaderexecutor::FuncBase_*>,_bool> pVar2;
  ulong local_48;
  size_t ndx;
  DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_30;
  _Base_ptr local_28;
  undefined1 local_20;
  set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  *local_18;
  FuncSet *dst_local;
  DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_18 = dst;
  dst_local = (FuncSet *)this;
  initialize(this);
  local_30 = this;
  pVar2 = std::
          set<const_vkt::shaderexecutor::FuncBase_*,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
          ::insert(local_18,(value_type *)&local_30);
  local_28 = (_Base_ptr)pVar2.first._M_node;
  local_20 = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_48 = 0;
    while( true ) {
      sVar1 = std::
              vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ::size(&this->m_body);
      if (sVar1 <= local_48) break;
      this_00 = &std::
                 vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                 ::operator[](&this->m_body,local_48)->
                 super_SharedPtr<const_vkt::shaderexecutor::Statement>;
      this_01 = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator->(this_00);
      Statement::getUsedFuncs(this_01,local_18);
      local_48 = local_48 + 1;
    }
    this_02 = &de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator->
                         ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&this->m_ret)->
               super_ExprBase;
    ExprBase::getUsedFuncs(this_02,local_18);
  }
  return;
}

Assistant:

void						doGetUsedFuncs	(FuncSet& dst) const
	{
		initialize();
		if (dst.insert(this).second)
		{
			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->getUsedFuncs(dst);
			m_ret->getUsedFuncs(dst);
		}
	}